

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createBranch(Builder *this,Block *block)

{
  Block *this_00;
  Id id;
  Instruction *this_01;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38 [3];
  Instruction *local_20;
  Instruction *branch;
  Block *block_local;
  Builder *this_local;
  
  branch = (Instruction *)block;
  block_local = (Block *)this;
  this_01 = (Instruction *)Instruction::operator_new((Instruction *)0x38,(size_t)block);
  Instruction::Instruction(this_01,OpBranch);
  local_20 = this_01;
  id = Block::getId((Block *)branch);
  Instruction::addIdOperand(this_01,id);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_38,local_20
            );
  Block::addInstruction(this_00,local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_38);
  Block::addPredecessor((Block *)branch,this->buildPoint);
  return;
}

Assistant:

void Builder::createBranch(Block* block)
{
    Instruction* branch = new Instruction(OpBranch);
    branch->addIdOperand(block->getId());
    buildPoint->addInstruction(std::unique_ptr<Instruction>(branch));
    block->addPredecessor(buildPoint);
}